

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_XMLVariant::As3dPoint(ON_3dPoint *__return_storage_ptr__,ON_XMLVariant *this)

{
  Types TVar1;
  ON_XMLVariantPrivate *pOVar2;
  double dVar3;
  bool bVar4;
  
  pOVar2 = this->_private;
  TVar1 = pOVar2->_type;
  if (2 < TVar1 - DoubleArray3) {
    if (TVar1 == String) {
      bVar4 = ON_wString::IsValid3dPoint(&pOVar2->_string_val);
      if (bVar4) {
        (*this->_vptr_ON_XMLVariant[0x31])(this,3);
      }
    }
    else {
      if (TVar1 != DoubleArray2) {
        __return_storage_ptr__->z = ON_3dPoint::Origin.z;
        dVar3 = ON_3dPoint::Origin.y;
        __return_storage_ptr__->x = ON_3dPoint::Origin.x;
        __return_storage_ptr__->y = dVar3;
        return __return_storage_ptr__;
      }
      (pOVar2->field_2).m_xform.m_xform[0][2] = 0.0;
    }
  }
  pOVar2 = this->_private;
  ON_3dPoint::ON_3dPoint
            (__return_storage_ptr__,(pOVar2->field_2)._double_val,
             (pOVar2->field_2).m_xform.m_xform[0][1],(pOVar2->field_2).m_xform.m_xform[0][2]);
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_XMLVariant::As3dPoint(void) const
{
  switch (_private->_type)
  {
  case Types::DoubleArray2:
    _private->_array_val[2] = 0.0;
    break;

  case Types::DoubleArray3:
  case Types::DoubleArray4:
  case Types::DoubleColor4:
    break;

  case Types::String:
    if (_private->_string_val.IsValid3dPoint())
      StringToPoint(3);
    break;

  default:
    return ON_3dPoint::Origin;
  }

  return ON_3dPoint(_private->_array_val[0], _private->_array_val[1], _private->_array_val[2]);
}